

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

_Bool al_make_path_canonical(ALLEGRO_PATH *path)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ALLEGRO_USTR *us;
  long in_RDI;
  uint i;
  uint in_stack_ffffffffffffffdc;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar4;
  uint local_c;
  
  local_c = 0;
  while (sVar2 = _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10)), local_c < sVar2) {
    pcVar3 = get_segment_cstr((ALLEGRO_PATH *)
                              CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
    iVar1 = strcmp(pcVar3,".");
    if (iVar1 == 0) {
      al_remove_path_component
                ((ALLEGRO_PATH *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    }
    else {
      local_c = local_c + 1;
    }
  }
  sVar2 = _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
  if (sVar2 != 0) {
    us = get_segment((ALLEGRO_PATH *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
    sVar2 = al_ustr_size(us);
    if (sVar2 == 0) {
      while( true ) {
        sVar2 = _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
        bVar4 = false;
        if (1 < sVar2) {
          pcVar3 = get_segment_cstr((ALLEGRO_PATH *)(ulong)in_stack_ffffffffffffffe0,
                                    in_stack_ffffffffffffffdc);
          iVar1 = strcmp(pcVar3,"..");
          bVar4 = iVar1 == 0;
        }
        if (bVar4 == false) break;
        al_remove_path_component
                  ((ALLEGRO_PATH *)CONCAT17(bVar4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      }
    }
  }
  return true;
}

Assistant:

bool al_make_path_canonical(ALLEGRO_PATH *path)
{
   unsigned i;
   ASSERT(path);

   for (i = 0; i < _al_vector_size(&path->segments); ) {
      if (strcmp(get_segment_cstr(path, i), ".") == 0)
         al_remove_path_component(path, i);
      else
         i++;
   }

   /* Remove leading '..'s on absolute paths. */
   if (_al_vector_size(&path->segments) >= 1 &&
      al_ustr_size(get_segment(path, 0)) == 0)
   {
      while (_al_vector_size(&path->segments) >= 2 &&
         strcmp(get_segment_cstr(path, 1), "..") == 0)
      {
         al_remove_path_component(path, 1);
      }
   }

   return true;
}